

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzBuffToBuffCompress
              (char *dest,uint *destLen,char *source,uint sourceLen,int blockSize100k,int verbosity,
              int workFactor)

{
  int iVar1;
  undefined4 in_ECX;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int ret;
  bz_stream strm;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_4;
  
  if ((((((in_RDI == 0) || (in_RSI == (int *)0x0)) || (in_RDX == 0)) ||
       ((in_R8D < 1 || (9 < in_R8D)))) ||
      ((in_R9D < 0 || ((4 < in_R9D || ((int)strm.next_in < 0)))))) || (0xfa < (int)strm.next_in)) {
    local_4 = -2;
  }
  else {
    local_4 = BZ2_bzCompressInit((bz_stream *)
                                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                 (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                 (int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    if (local_4 == 0) {
      iVar1 = *in_RSI;
      local_4 = BZ2_bzCompress((bz_stream *)CONCAT44(in_stack_ffffffffffffff8c,in_ECX),
                               (int)((ulong)in_RDX >> 0x20));
      if (local_4 == 3) {
        BZ2_bzCompressEnd((bz_stream *)CONCAT44(3,in_stack_ffffffffffffff78));
        local_4 = -8;
      }
      else if (local_4 == 4) {
        *in_RSI = *in_RSI - iVar1;
        BZ2_bzCompressEnd((bz_stream *)CONCAT44(4,in_stack_ffffffffffffff78));
        local_4 = 0;
      }
      else {
        BZ2_bzCompressEnd((bz_stream *)CONCAT44(local_4,in_stack_ffffffffffffff78));
      }
    }
  }
  return local_4;
}

Assistant:

int BZ_API(BZ2_bzBuffToBuffCompress)
                         ( char*         dest,
                           unsigned int* destLen,
                           char*         source,
                           unsigned int  sourceLen,
                           int           blockSize100k,
                           int           verbosity,
                           int           workFactor )
{
   bz_stream strm;
   int ret;

   if (dest == NULL || destLen == NULL ||
       source == NULL ||
       blockSize100k < 1 || blockSize100k > 9 ||
       verbosity < 0 || verbosity > 4 ||
       workFactor < 0 || workFactor > 250)
      return BZ_PARAM_ERROR;

   if (workFactor == 0) workFactor = 30;
   strm.bzalloc = NULL;
   strm.bzfree = NULL;
   strm.opaque = NULL;
   ret = BZ2_bzCompressInit ( &strm, blockSize100k,
                              verbosity, workFactor );
   if (ret != BZ_OK) return ret;

   strm.next_in = source;
   strm.next_out = dest;
   strm.avail_in = sourceLen;
   strm.avail_out = *destLen;

   ret = BZ2_bzCompress ( &strm, BZ_FINISH );
   if (ret == BZ_FINISH_OK) goto output_overflow;
   if (ret != BZ_STREAM_END) goto errhandler;

   /* normal termination */
   *destLen -= strm.avail_out;
   BZ2_bzCompressEnd ( &strm );
   return BZ_OK;

   output_overflow:
   BZ2_bzCompressEnd ( &strm );
   return BZ_OUTBUFF_FULL;

   errhandler:
   BZ2_bzCompressEnd ( &strm );
   return ret;
}